

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

void __thiscall
pstore::index::details::internal_node::internal_node
          (internal_node *this,index_pointer *existing_leaf,index_pointer *new_leaf,
          hash_type existing_hash,hash_type new_hash)

{
  uint uVar1;
  index_pointer *local_48;
  uint index_b;
  uint index_a;
  hash_type new_hash_local;
  hash_type existing_hash_local;
  index_pointer *new_leaf_local;
  index_pointer *existing_leaf_local;
  internal_node *this_local;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x6c616e7265746e49;
  this->bitmap_ = 1L << ((byte)existing_hash & 0x3f) | 1L << ((byte)new_hash & 0x3f);
  local_48 = (index_pointer *)this->children_;
  do {
    index_pointer::index_pointer(local_48);
    local_48 = local_48 + 8;
  } while ((internal_node *)local_48 != this + 1);
  uVar1 = get_new_index(new_hash,existing_hash);
  if ((uVar1 & 1) == uVar1) {
    if (uVar1 == (uVar1 == 0)) {
      assert_failed("index_a != index_b",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0xcb);
    }
    this->children_[uVar1] = *new_leaf;
    this->children_[(uint)(uVar1 == 0)] = *existing_leaf;
    return;
  }
  assert_failed("(index_a & 1) == index_a",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,200);
}

Assistant:

internal_node::internal_node (index_pointer const & existing_leaf,
                                          index_pointer const & new_leaf,
                                          hash_type const existing_hash, hash_type const new_hash)
                    : bitmap_ (hash_type{1} << existing_hash | hash_type{1} << new_hash) {

                auto const index_a = get_new_index (new_hash, existing_hash);
                auto const index_b = static_cast<unsigned> (index_a == 0);

                PSTORE_ASSERT ((index_a & 1) ==
                               index_a); //! OCLINT(PH - bitwise in conditional is ok)
                PSTORE_ASSERT ((index_b & 1) ==
                               index_b); //! OCLINT(PH - bitwise in conditional is ok)
                PSTORE_ASSERT (index_a != index_b);

                children_[index_a] = index_pointer{new_leaf};
                children_[index_b] = existing_leaf;
            }